

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O2

size_t der_len_len(size_t len)

{
  size_t sVar1;
  
  sVar1 = 1;
  if (0x7f < len) {
    for (; len != 0; len = len >> 8) {
      sVar1 = sVar1 + 1;
    }
  }
  return sVar1;
}

Assistant:

static size_t der_len_len(size_t len) {
  if (len < 0x80) {
    return 1;
  }
  size_t ret = 1;
  while (len > 0) {
    ret++;
    len >>= 8;
  }
  return ret;
}